

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# magic.c
# Opt level: O0

void spell_heavenly_sceptre_fire(int sn,int level,CHAR_DATA *ch,void *vo,int target)

{
  bool bVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  CHAR_DATA *in_RDX;
  int in_EDI;
  CHAR_DATA *victim;
  int dam;
  OBJ_DATA *sceptre;
  AFFECT_DATA af;
  undefined4 in_stack_ffffffffffffff58;
  int in_stack_ffffffffffffff5c;
  CHAR_DATA *ch_00;
  undefined4 in_stack_ffffffffffffff68;
  int in_stack_ffffffffffffff6c;
  CHAR_DATA *ch_01;
  undefined1 in_stack_ffffffffffffff7b;
  int in_stack_ffffffffffffff7c;
  int in_stack_ffffffffffffff80;
  int in_stack_ffffffffffffff84;
  CHAR_DATA *in_stack_ffffffffffffff88;
  undefined2 in_stack_ffffffffffffff90;
  undefined2 in_stack_ffffffffffffff92;
  undefined2 in_stack_ffffffffffffff94;
  undefined2 in_stack_ffffffffffffff96;
  undefined2 in_stack_ffffffffffffff98;
  undefined2 in_stack_ffffffffffffff9a;
  undefined2 in_stack_ffffffffffffff9c;
  undefined2 in_stack_ffffffffffffff9e;
  int in_stack_ffffffffffffffa0;
  
  ch_01 = (CHAR_DATA *)0x0;
  ch_00 = in_RDX->fighting;
  bVar1 = is_affected(in_RDX,in_EDI);
  if (((bVar1) || (ch_00 == (CHAR_DATA *)0x0)) || (in_RDX->level < 0x1e)) {
    act((char *)ch_01,(CHAR_DATA *)CONCAT44(in_stack_ffffffffffffff6c,in_stack_ffffffffffffff68),
        ch_00,(void *)CONCAT44(in_stack_ffffffffffffff5c,in_stack_ffffffffffffff58),0);
    send_to_char((char *)ch_01,
                 (CHAR_DATA *)CONCAT44(in_stack_ffffffffffffff6c,in_stack_ffffffffffffff68));
    WAIT_STATE(ch_01,in_stack_ffffffffffffff6c);
  }
  else {
    iVar2 = dice((int)ch_00,in_stack_ffffffffffffff5c);
    bVar1 = saves_spell(in_stack_ffffffffffffffa0,
                        (CHAR_DATA *)
                        CONCAT26(in_stack_ffffffffffffff9e,
                                 CONCAT24(in_stack_ffffffffffffff9c,
                                          CONCAT22(in_stack_ffffffffffffff9a,
                                                   in_stack_ffffffffffffff98))),
                        CONCAT22(in_stack_ffffffffffffff96,in_stack_ffffffffffffff94));
    if (bVar1) {
      iVar2 = iVar2 / 2;
    }
    bVar1 = saves_spell(in_stack_ffffffffffffffa0,
                        (CHAR_DATA *)
                        CONCAT26(in_stack_ffffffffffffff9e,
                                 CONCAT24(in_stack_ffffffffffffff9c,
                                          CONCAT22(in_stack_ffffffffffffff9a,
                                                   in_stack_ffffffffffffff98))),
                        CONCAT22(in_stack_ffffffffffffff96,in_stack_ffffffffffffff94));
    if (bVar1) {
      iVar2 = iVar2 / 2;
    }
    damage_old((CHAR_DATA *)
               CONCAT26(in_stack_ffffffffffffff96,
                        CONCAT24(in_stack_ffffffffffffff94,
                                 CONCAT22(in_stack_ffffffffffffff92,in_stack_ffffffffffffff90))),
               in_stack_ffffffffffffff88,in_stack_ffffffffffffff84,in_stack_ffffffffffffff80,
               in_stack_ffffffffffffff7c,(bool)in_stack_ffffffffffffff7b);
    bVar1 = is_npc((CHAR_DATA *)CONCAT44(in_stack_ffffffffffffff5c,in_stack_ffffffffffffff58));
    if (!bVar1) {
      iVar3 = number_percent();
      iVar4 = in_RDX->level * 2;
      if (iVar3 == iVar4 || SBORROW4(iVar3,iVar4) != iVar3 + in_RDX->level * -2 < 0) {
        init_affect((AFFECT_DATA *)0x6202a8);
        affect_to_char(ch_00,(AFFECT_DATA *)
                             CONCAT44(in_stack_ffffffffffffff5c,in_stack_ffffffffffffff58));
      }
      else {
        act((char *)ch_01,(CHAR_DATA *)CONCAT44(iVar2,in_stack_ffffffffffffff68),ch_00,
            (void *)CONCAT44(in_stack_ffffffffffffff5c,in_stack_ffffffffffffff58),0);
        send_to_char((char *)ch_01,(CHAR_DATA *)CONCAT44(iVar2,in_stack_ffffffffffffff68));
        extract_obj((OBJ_DATA *)CONCAT44(in_stack_ffffffffffffff84,in_stack_ffffffffffffff80));
      }
    }
  }
  return;
}

Assistant:

void spell_heavenly_sceptre_fire(int sn, int level, CHAR_DATA *ch, void *vo, int target)
{
	AFFECT_DATA af;
	OBJ_DATA *sceptre = nullptr;
	int dam;
	CHAR_DATA *victim;

	victim = ch->fighting;

	if (is_affected(ch, sn) || victim == nullptr || ch->level < 30)
	{
		act("$n's sceptre hums softly but nothing seems to happen.", ch, 0, 0, TO_ROOM);
		send_to_char("Your sceptre hums softly but nothing seems to happen.\n\r", ch);
		WAIT_STATE(ch, 12);
		return;
	}

	dam = dice(15, 20);

	if (saves_spell(ch->level, victim, DAM_HOLY))
		dam /= 2;

	if (saves_spell(65, victim, DAM_OTHER))
		dam /= 2;

	damage_old(ch, victim, dam, sn, DAM_HOLY, true);

	if (is_npc(ch))
		return;

	if (number_percent() > ch->level * 2)
	{
		act("Your sceptre of heavenly orders crumbles to dust.", ch, 0, 0, TO_ROOM);
		send_to_char("Your sceptre of heavenly orders crumbles to dust.\n\r", ch);
		extract_obj(sceptre);
		return;
	}

	init_affect(&af);
	af.where = TO_AFFECTS;
	af.aftype = AFT_SPELL;
	af.type = sn;
	af.modifier = 0;
	af.duration = 1;
	af.location = 0;
	af.level = ch->level;
	affect_to_char(ch, &af);
}